

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtrie.c
# Opt level: O1

void precount_char_init(void)

{
  char cVar1;
  long lVar2;
  uint8_t (*pauVar3) [8];
  int i;
  long lVar4;
  uint8_t (*pauVar5) [8];
  uint8_t local_38 [8];
  uint8_t res [8];
  
  lVar4 = 1;
  pauVar5 = precount2[0] + 2;
  do {
    local_38[0] = '\0';
    local_38[1] = '\0';
    local_38[2] = '\0';
    local_38[3] = '\0';
    local_38[4] = '\0';
    local_38[5] = '\0';
    local_38[6] = '\0';
    local_38[7] = '\0';
    char_get_bits_raised(local_38,(uint8_t)lVar4);
    lVar2 = -0x60;
    pauVar3 = pauVar5;
    do {
      if (((((local_38[0] != '\0') &&
            (cVar1 = (char)lVar2, pauVar3[-1][1] = local_38[0] + cVar1 + '`', local_38[1] != '\0'))
           && (pauVar3[-1][2] = local_38[1] + cVar1 + '`', local_38[2] != '\0')) &&
          ((pauVar3[-1][3] = local_38[2] + cVar1 + '`', local_38[3] != '\0' &&
           (pauVar3[-1][4] = local_38[3] + cVar1 + '`', local_38[4] != '\0')))) &&
         ((pauVar3[-1][5] = local_38[4] + cVar1 + '`', local_38[5] != '\0' &&
          ((pauVar3[-1][6] = local_38[5] + cVar1 + '`', local_38[6] != '\0' &&
           (pauVar3[-1][7] = local_38[6] + cVar1 + '`', local_38[7] != '\0')))))) {
        (*pauVar3)[0] = local_38[7] + cVar1 + '`';
      }
      pauVar3 = pauVar3 + 0x100;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0);
    lVar4 = lVar4 + 1;
    pauVar5 = pauVar5 + 1;
  } while (lVar4 != 0x101);
  return;
}

Assistant:

void precount_char_init() {
    for (int i = 1; i <= 256; ++i) { //each byte value cycle
        uint8_t res[8] = {};
        char_get_bits_raised(res, i);
        for (uint8_t j = 0; j < 12; ++j) { //each bitmask index value cycle
            int j_shift = j << 3;
            char k = 0;
            //this construction works even on -O3 and -Ofast
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
            else continue;
            if (res[k]) precount2[j][i][k] = res[k++] + j_shift;
        }
    }
}